

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::TypeSpecializeIntUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,int32 min,int32 max,
          Value *src1OriginalVal,bool *redoTypeSpecRef,bool skipDst)

{
  OpCode OVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  RegOpnd *pRVar12;
  IntConstOpnd *pIVar13;
  AddSubConstantInfo *addSubConstantInfo_00;
  JITTimeFunctionBody *pJVar14;
  FunctionJITTimeInfo *pFVar15;
  char16 *pcVar16;
  Value *pVVar17;
  uint uVar18;
  ulong uVar19;
  char *pDstVal_00;
  Instr *pIVar20;
  uint uVar21;
  Value *src1Value;
  byte bVar22;
  bool lossy;
  byte bVar23;
  Value *local_98;
  Value *src2Val;
  AddSubConstantInfo addSubConstantInfo;
  Value *src1IndirIndexVal;
  BailOutKind local_50;
  OpCode local_3a;
  
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1f87,"(pSrc1Val)","pSrc1Val");
    if (!bVar4) goto LAB_0045ec7c;
    *puVar11 = 0;
  }
  bVar23 = this->field_0xf4;
  OVar5 = IR::Opnd::GetKind((*pInstr)->m_src1);
  if (OVar5 == OpndKindReg) {
    pOVar2 = (*pInstr)->m_src1;
    OVar5 = IR::Opnd::GetKind(pOVar2);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0045ec7c;
      *puVar11 = 0;
    }
    if (((ulong)pOVar2[1]._vptr_Opnd[3] & 2) != 0) {
      return false;
    }
  }
  bVar23 = bVar23 >> 2;
  bVar22 = bVar23 & 1;
  src2Val = (Value *)0x0;
  pIVar20 = *pInstr;
  OVar1 = pIVar20->m_opcode;
  bVar4 = false;
  uVar21 = min;
  uVar7 = max;
  if (LdMethodElem < OVar1) {
    if (OVar1 < ArgOut_A_Inline) {
      pDstVal_00 = (char *)(ulong)(OVar1 - 0x9a);
      if (OVar1 - 0x9a < 0x38) {
        if ((0xa0003000000000U >> ((ulong)pDstVal_00 & 0x3f) & 1) != 0) {
          return false;
        }
        if ((5UL >> ((ulong)pDstVal_00 & 0x3f) & 1) != 0) goto LAB_0045e071;
      }
      if (OVar1 != MultiBr) {
        if (OVar1 == LdC_A_I4) {
          pIVar13 = (IntConstOpnd *)pIVar20->m_src1;
          OVar5 = IR::Opnd::GetKind((Opnd *)pIVar13);
          if (OVar5 != OpndKindIntConst) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
            if (!bVar4) goto LAB_0045ec7c;
            *puVar11 = 0;
          }
          uVar7 = IR::IntConstOpnd::AsInt32(pIVar13);
          lossy = false;
          bVar4 = false;
          local_3a = Ld_I4;
          uVar21 = uVar7;
          goto LAB_0045e4c6;
        }
        goto switchD_0045e120_caseD_25;
      }
      local_3a = MultiBr;
    }
    else {
      pDstVal_00 = (char *)(ulong)(OVar1 - 0x1ed);
      if (OVar1 - 0x1ed < 0x40) {
        if ((0xc79UL >> ((ulong)pDstVal_00 & 0x3f) & 1) != 0) {
          return false;
        }
        if ((Value **)pDstVal_00 == (Value **)0x3f) {
LAB_0045e071:
          pOVar2 = pIVar20->m_dst;
          OVar5 = IR::Opnd::GetKind(pOVar2);
          if (OVar5 == OpndKindIndir) {
LAB_0045e0da:
            addSubConstantInfo._16_2_ = *(undefined2 *)(pOVar2[1]._vptr_Opnd + 1);
            bVar4 = ValueType::IsLikelyAnyArrayWithNativeFloatValues
                              ((ValueType *)&addSubConstantInfo.srcValueIsLikelyConstant);
            if (bVar4) {
              *pSrc1Val = src1OriginalVal;
            }
            else {
              src1OriginalVal = *pSrc1Val;
            }
            bVar4 = TypeSpecializeStElem(this,pInstr,src1OriginalVal,(Value **)pDstVal_00);
            return bVar4;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          pDstVal_00 = "Bad call to AsIndirOpnd()";
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (bVar4) {
            *puVar11 = 0;
            goto LAB_0045e0da;
          }
          goto LAB_0045ec7c;
        }
      }
switchD_0045e120_caseD_25:
      bVar4 = OpCodeAttr::IsInlineBuiltIn(OVar1);
      if (!bVar4) {
        return false;
      }
      local_3a = (*pInstr)->m_opcode;
    }
    lossy = false;
    goto LAB_0045e450;
  }
  uVar19 = (ulong)(OVar1 - 0x43);
  if (OVar1 - 0x43 < 0x3c) {
    if ((0x8a8a00000400000U >> (uVar19 & 0x3f) & 1) != 0) {
      return false;
    }
    if (uVar19 != 0) {
      if (uVar19 != 2) goto code_r0x0045e112;
      OVar5 = IR::Opnd::GetKind(pIVar20->m_src1);
      if (OVar5 == OpndKindReg) {
        pRVar12 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        bVar6 = GlobOptBlockData::IsInt32TypeSpecialized
                          (&this->currentBlock->globOptData,&pRVar12->m_sym->super_Sym);
        lossy = false;
        local_3a = Ld_I4;
        bVar4 = true;
        if (!bVar6) {
          return false;
        }
        goto LAB_0045e4c6;
      }
    }
    lossy = false;
    local_3a = Ld_I4;
    bVar4 = true;
    goto LAB_0045e4c6;
  }
code_r0x0045e112:
  switch(OVar1) {
  case Ret:
    goto switchD_0045e120_caseD_24;
  case Yield:
    goto switchD_0045e120_caseD_25;
  case Incr_A:
    uVar21 = min + 1;
    if (SCARRY4(min,1)) {
      bVar4 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                        ((anon_class_16_2_639d4b01 *)(*pSrc1Val)->valueInfo);
      uVar21 = 0x7fffffff;
      if (bVar4) goto LAB_0045e14b;
      bVar4 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
      if (bVar4) {
        return false;
      }
      uVar7 = 0x7fffffff;
      uVar21 = 0x80000000;
      bVar22 = 1;
      local_50 = BailOutInvalid;
    }
    else {
LAB_0045e14b:
      local_50 = BailOutInvalid;
      uVar7 = max + 1;
      if (SCARRY4(max,1)) {
        bVar4 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                          ((anon_class_16_2_639d4b01 *)(*pSrc1Val)->valueInfo);
        uVar7 = 0x7fffffff;
        if (!bVar4) {
          bVar4 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
          if (!bVar4) {
            local_50 = BailOutInvalid;
            uVar7 = 0x7fffffff;
            uVar21 = 0x80000000;
            bVar22 = 1;
            goto LAB_0045e668;
          }
          if ((this->field_0xf5 & 2) == 0) {
            return false;
          }
          uVar7 = 0x7fffffff;
          local_50 = BailOutOnOverflow;
        }
      }
      if (((bVar23 & 1) == 0) &&
         (OVar5 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar5 == OpndKindReg)) {
        pRVar12 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        AddSubConstantInfo::Set
                  ((AddSubConstantInfo *)&src2Val,pRVar12->m_sym,*pSrc1Val,min == max,1);
      }
    }
LAB_0045e668:
    local_3a = Add_I4;
    goto LAB_0045e672;
  case Decr_A:
    uVar7 = max - 1;
    if (SBORROW4(max,1)) {
      bVar4 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                        ((anon_class_16_2_639d4b01 *)(*pSrc1Val)->valueInfo);
      uVar7 = 0x80000000;
      if (bVar4) goto LAB_0045e367;
      bVar4 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
      if (bVar4) {
        return false;
      }
      uVar7 = 0x7fffffff;
      uVar21 = 0x80000000;
      bVar22 = 1;
      local_50 = BailOutInvalid;
    }
    else {
LAB_0045e367:
      local_50 = BailOutInvalid;
      uVar21 = min - 1;
      if (SBORROW4(min,1)) {
        bVar4 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                          ((anon_class_16_2_639d4b01 *)(*pSrc1Val)->valueInfo);
        uVar21 = 0x80000000;
        if (!bVar4) {
          bVar4 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
          if (!bVar4) {
            local_50 = BailOutInvalid;
            uVar7 = 0x7fffffff;
            uVar21 = 0x80000000;
            bVar22 = 1;
            goto LAB_0045e648;
          }
          if ((this->field_0xf5 & 2) == 0) {
            return false;
          }
          uVar21 = 0x80000000;
          local_50 = BailOutOnOverflow;
        }
      }
      if (((bVar23 & 1) == 0) &&
         (OVar5 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar5 == OpndKindReg)) {
        pRVar12 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        AddSubConstantInfo::Set
                  ((AddSubConstantInfo *)&src2Val,pRVar12->m_sym,*pSrc1Val,min == max,-1);
      }
    }
LAB_0045e648:
    local_3a = Sub_I4;
LAB_0045e672:
    if (this->prePassLoop == (Loop *)0x0) {
      pIVar20 = *pInstr;
      pIVar13 = IR::IntConstOpnd::New(1,TyInt32,pIVar20->m_func,false);
      IR::Instr::SetSrc2(pIVar20,&pIVar13->super_Opnd);
    }
    bVar23 = 0;
LAB_0045e6ae:
    if ((((bVar23 == 0) && (bVar22 == 0)) &&
        (bVar4 = IR::Instr::ShouldCheckForIntOverflow(*pInstr), bVar4)) &&
       (bVar4 = IsWorthSpecializingToInt32(this,*pInstr,*pSrc1Val,(Value *)0x0), !bVar4)) {
      pIVar20 = *pInstr;
      if (((local_50 == BailOutInvalid) && (pIVar20->m_dst != (Opnd *)0x0)) &&
         (((this->field_0xf5 & 2) != 0 || (this->prePassLoop == (Loop *)0x0)))) {
        pVVar17 = CreateDstUntransferredIntValue(this,uVar21,uVar7,pIVar20,*pSrc1Val,(Value *)0x0);
        *pDstVal = pVVar17;
        pIVar20 = *pInstr;
      }
      if (pIVar20->m_src2 == (Opnd *)0x0) {
        return false;
      }
      IR::Instr::FreeSrc2(pIVar20);
      return false;
    }
    uVar8 = (*(uint *)&this->field_0xf4 & 0xfffffff3) + (uint)bVar22 * 4;
    uVar18 = (uint)bVar23 << 3;
    lossy = false;
    bVar4 = false;
    goto LAB_0045e709;
  case Neg_A:
    local_50 = BailOutInvalid;
    if (max < 0 || 0 < min) {
      bVar23 = 0;
    }
    else {
      bVar4 = IR::Instr::ShouldCheckForNegativeZero(pIVar20);
      bVar23 = 1;
      if (bVar4) {
        bVar23 = 0;
        if (max == 0 && min == 0) {
          return false;
        }
        local_50 = BailOutOnNegativeZero;
        if ((*(uint *)&this->field_0xf4 & 0x200) == 0) {
          return false;
        }
      }
    }
    uVar8 = -min;
    uVar18 = -max;
    bVar4 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
    uVar7 = 0x7fffffff;
    if ((int)uVar18 <= (int)uVar8 || bVar4) {
      uVar7 = uVar8;
    }
    uVar21 = 0x80000000;
    if ((int)uVar18 <= (int)uVar8 || bVar4) {
      uVar21 = uVar18;
    }
    local_3a = Neg_I4;
    goto LAB_0045e6ae;
  case Not_A:
    if ((this->field_0xf5 & 0x10) == 0) {
      return false;
    }
    uVar8 = ~min;
    uVar7 = ~max;
    uVar21 = uVar7;
    if ((int)uVar8 < (int)uVar7) {
      uVar21 = uVar8;
    }
    if ((int)uVar7 < (int)uVar8) {
      uVar7 = uVar8;
    }
    local_3a = Not_I4;
    lossy = true;
    break;
  default:
    if (1 < OVar1 - 0xe) goto switchD_0045e120_caseD_25;
    bVar4 = DoConstFold(this);
    if (((bVar4) && (this->prePassLoop == (Loop *)0x0)) &&
       (bVar4 = TryOptConstFoldBrFalse(this,*pInstr,*pSrc1Val,min,max), bVar4)) {
      return true;
    }
    bVar4 = ValueInfo::HasIntConstantValue((*pSrc1Val)->valueInfo,false);
    bVar6 = true;
    if ((!bVar4) && (OVar5 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar5 == OpndKindReg)) {
      pRVar12 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
      bVar6 = GlobOptBlockData::IsInt32TypeSpecialized
                        (&this->currentBlock->globOptData,&pRVar12->m_sym->super_Sym);
    }
    if ((*pInstr)->m_opcode == BrTrue_A) {
      UpdateIntBoundsForNotEqualBranch(this,*pSrc1Val,(Value *)0x0,0);
      local_3a = BrTrue_I4;
    }
    else {
      UpdateIntBoundsForEqualBranch(this,*pSrc1Val,(Value *)0x0,0);
      local_3a = BrFalse_I4;
    }
    lossy = false;
    if (bVar6 == false) {
      return false;
    }
    uVar7 = 1;
    uVar21 = 2;
  }
LAB_0045e450:
  bVar4 = false;
LAB_0045e4c6:
  uVar8 = (*(uint *)&this->field_0xf4 & 0xfffffff3) + (uint)bVar22 * 4;
  local_50 = BailOutInvalid;
  uVar18 = 0;
LAB_0045e709:
  *(uint *)&this->field_0xf4 = uVar8 | uVar18;
  addSubConstantInfo.srcValueIsLikelyConstant = false;
  addSubConstantInfo._17_3_ = 0;
  addSubConstantInfo.offset = 0;
  local_98 = (Value *)0x0;
  bVar6 = CSEOptimize(this,this->currentBlock,pInstr,pSrc1Val,&local_98,
                      (Value **)&addSubConstantInfo.srcValueIsLikelyConstant,true);
  if (bVar6) {
    *redoTypeSpecRef = true;
    return false;
  }
  pIVar20 = *pInstr;
  OVar1 = pIVar20->m_opcode;
  if (this->prePassLoop == (Loop *)0x0) {
    pIVar20->m_opcode = local_3a;
  }
  if (lossy == false) {
    src1OriginalVal = *pSrc1Val;
  }
  ToTypeSpecUse(this,pIVar20,pIVar20->m_src1,this->currentBlock,src1OriginalVal,(IndirOpnd *)0x0,
                TyInt32,BailOutIntOnly,lossy,(Instr *)0x0);
  if ((local_50 != BailOutInvalid) && (this->prePassLoop == (Loop *)0x0)) {
    GenerateBailAtOperation(this,pInstr,local_50);
  }
  if ((!skipDst) && (pIVar20 = *pInstr, pIVar20->m_dst != (Opnd *)0x0)) {
    if (bVar4) {
      if ((this->prePassLoop == (Loop *)0x0) && ((uVar21 != min || (uVar7 != max)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x214a,
                           "(!(isTransfer && !this->IsLoopPrePass()) || min == newMin && max == newMax)"
                           ,"If this is just a copy, old/new min/max should be the same");
        if (!bVar4) {
LAB_0045ec7c:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar11 = 0;
        pIVar20 = *pInstr;
      }
      pVVar17 = *pSrc1Val;
      src1Value = pVVar17;
    }
    else {
      src1Value = *pSrc1Val;
      pVVar17 = (Value *)0x0;
    }
    addSubConstantInfo_00 = (AddSubConstantInfo *)&src2Val;
    if (src2Val == (Value *)0x0) {
      addSubConstantInfo_00 = (AddSubConstantInfo *)0x0;
    }
    TypeSpecializeIntDst
              (this,pIVar20,OVar1,pVVar17,src1Value,(Value *)0x0,local_50,uVar21,uVar7,pDstVal,
               addSubConstantInfo_00);
  }
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar9,uVar10);
  if (local_50 == BailOutInvalid) {
    if (bVar4) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Type specialized to INT\n");
      Output::Flush();
    }
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,AggressiveIntTypeSpecPhase);
    if (!bVar4) {
      return true;
    }
    Output::Print(L"Type specialized to INT: ");
  }
  else {
    if (bVar4) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Type specialized to INT with bailout on:\n");
      Output::Flush();
    }
    if ((local_50 >> 10 & 1) != 0) {
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar9,uVar10);
      if (bVar4) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"    Overflow\n");
        Output::Flush();
      }
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,AggressiveIntTypeSpecPhase);
      if (bVar4) {
        Output::Print(L"Type specialized to INT with bailout (%S): ","Overflow");
        pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
        Output::Print(L"%s \n",pcVar16);
      }
    }
    if (local_50 >> 0xc == 0) {
      return true;
    }
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar9,uVar10);
    if (bVar4) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"    Zero\n");
      Output::Flush();
    }
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,AggressiveIntTypeSpecPhase);
    if (!bVar4) {
      return true;
    }
    Output::Print(L"Type specialized to INT with bailout (%S): ","Zero");
  }
  bVar4 = true;
  pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
  Output::Print(L"%s \n",pcVar16);
switchD_0045e120_caseD_24:
  return bVar4;
}

Assistant:

bool
GlobOpt::TypeSpecializeIntUnary(
    IR::Instr **pInstr,
    Value **pSrc1Val,
    Value **pDstVal,
    int32 min,
    int32 max,
    Value *const src1OriginalVal,
    bool *redoTypeSpecRef,
    bool skipDst /* = false */)
{
    IR::Instr *&instr = *pInstr;

    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;

    bool isTransfer = false;
    Js::OpCode opcode;
    int32 newMin, newMax;
    bool lossy = false;
    IR::BailOutKind bailOutKind = IR::BailOutInvalid;
    bool ignoredIntOverflow = this->ignoredIntOverflowForCurrentInstr;
    bool ignoredNegativeZero = false;
    bool checkTypeSpecWorth = false;

    if(instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym->m_isNotNumber)
    {
        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
    }

    AddSubConstantInfo addSubConstantInfo;

    switch(instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
            if (CurrentBlockData()->IsInt32TypeSpecialized(sym) == false)
            {
                // Type specializing an Ld_A isn't worth it, unless the src
                // is already type specialized.
                return false;
            }
        }
        newMin = min;
        newMax = max;
        opcode = Js::OpCode::Ld_I4;
        isTransfer = true;
        break;

    case Js::OpCode::Conv_Num:
        newMin = min;
        newMax = max;
        opcode = Js::OpCode::Ld_I4;
        isTransfer = true;
        break;

    case Js::OpCode::LdC_A_I4:
        newMin = newMax = instr->GetSrc1()->AsIntConstOpnd()->AsInt32();
        opcode = Js::OpCode::Ld_I4;
        break;

    case Js::OpCode::Neg_A:
        if (min <= 0 && max >= 0)
        {
            if(instr->ShouldCheckForNegativeZero())
            {
                // -0 matters since the sym is not a local, or is used in a way in which -0 would differ from +0
                if(!DoAggressiveIntTypeSpec())
                {
                    // May result in -0
                    // Consider adding a dynamic check for src1 == 0
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                if(min == 0 && max == 0)
                {
                    // Always results in -0
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnNegativeZero;
            }
            else
            {
                ignoredNegativeZero = true;
            }
        }
        if (Int32Math::Neg(min, &newMax))
        {
            if(instr->ShouldCheckForIntOverflow())
            {
                if(!DoAggressiveIntTypeSpec())
                {
                    // May overflow
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                if(min == max)
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnOverflow;
                newMax = INT32_MAX;
            }
            else
            {
                ignoredIntOverflow = true;
            }
        }
        if (Int32Math::Neg(max, &newMin))
        {
            if(instr->ShouldCheckForIntOverflow())
            {
                if(!DoAggressiveIntTypeSpec())
                {
                    // May overflow
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnOverflow;
                newMin = INT32_MAX;
            }
            else
            {
                ignoredIntOverflow = true;
            }
        }
        if(!instr->ShouldCheckForIntOverflow() && newMin > newMax)
        {
            // When ignoring overflow, the range needs to account for overflow. Since MIN_INT is the only int32 value that
            // overflows on Neg, and the value resulting from overflow is also MIN_INT, if calculating only the new min or new
            // max overflowed but not both, then the new min will be greater than the new max. In that case we need to consider
            // the full range of int32s as possible resulting values.
            newMin = INT32_MIN;
            newMax = INT32_MAX;
        }
        opcode = Js::OpCode::Neg_I4;
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::Not_A:
        if(!DoLossyIntTypeSpec())
        {
            return false;
        }
        this->PropagateIntRangeForNot(min, max, &newMin, &newMax);
        opcode = Js::OpCode::Not_I4;
        lossy = true;
        break;

    case Js::OpCode::Incr_A:
        do // while(false)
        {
            const auto CannotOverflowBasedOnRelativeBounds = [&]()
            {
                const ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
                return
                    (src1ValueInfo->IsInt() || DoAggressiveIntTypeSpec()) &&
                    src1ValueInfo->IsIntBounded() &&
                    src1ValueInfo->AsIntBounded()->Bounds()->AddCannotOverflowBasedOnRelativeBounds(1);
            };

            if (Int32Math::Inc(min, &newMin))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMin = INT32_MAX;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                else
                {
                    // When ignoring overflow, the range needs to account for overflow. For any Add or Sub, since overflow
                    // causes the value to wrap around, and we don't have a way to specify a lower and upper range of ints,
                    // we use the full range of int32s.
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
            if (Int32Math::Inc(max, &newMax))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMax = INT32_MAX;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    if(!DoAggressiveIntTypeSpec())
                    {
                        // May overflow
                        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                    }
                    bailOutKind |= IR::BailOutOnOverflow;
                    newMax = INT32_MAX;
                }
                else
                {
                    // See comment about ignoring overflow above
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
        } while(false);

        if(!ignoredIntOverflow && instr->GetSrc1()->IsRegOpnd())
        {
            addSubConstantInfo.Set(instr->GetSrc1()->AsRegOpnd()->m_sym, src1Val, min == max, 1);
        }

        opcode = Js::OpCode::Add_I4;
        if (!this->IsLoopPrePass())
        {
            instr->SetSrc2(IR::IntConstOpnd::New(1, TyInt32, instr->m_func));
        }
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::Decr_A:
        do // while(false)
        {
            const auto CannotOverflowBasedOnRelativeBounds = [&]()
            {
                const ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
                return
                    (src1ValueInfo->IsInt() || DoAggressiveIntTypeSpec()) &&
                    src1ValueInfo->IsIntBounded() &&
                    src1ValueInfo->AsIntBounded()->Bounds()->SubCannotOverflowBasedOnRelativeBounds(1);
            };

            if (Int32Math::Dec(max, &newMax))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMax = INT32_MIN;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                else
                {
                    // When ignoring overflow, the range needs to account for overflow. For any Add or Sub, since overflow
                    // causes the value to wrap around, and we don't have a way to specify a lower and upper range of ints, we
                    // use the full range of int32s.
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
            if (Int32Math::Dec(min, &newMin))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMin = INT32_MIN;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    if(!DoAggressiveIntTypeSpec())
                    {
                        // May overflow
                        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                    }
                    bailOutKind |= IR::BailOutOnOverflow;
                    newMin = INT32_MIN;
                }
                else
                {
                    // See comment about ignoring overflow above
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
        } while(false);

        if(!ignoredIntOverflow && instr->GetSrc1()->IsRegOpnd())
        {
            addSubConstantInfo.Set(instr->GetSrc1()->AsRegOpnd()->m_sym, src1Val, min == max, -1);
        }

        opcode = Js::OpCode::Sub_I4;
        if (!this->IsLoopPrePass())
        {
            instr->SetSrc2(IR::IntConstOpnd::New(1, TyInt32, instr->m_func));
        }
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::BrFalse_A:
    case Js::OpCode::BrTrue_A:
    {
        if(DoConstFold() && !IsLoopPrePass() && TryOptConstFoldBrFalse(instr, src1Val, min, max))
        {
            return true;
        }

        bool specialize = true;
        if (!src1Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc1()->IsRegOpnd())
        {
            StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
            if (CurrentBlockData()->IsInt32TypeSpecialized(sym) == false)
            {
                // Type specializing a BrTrue_A/BrFalse_A isn't worth it, unless the src
                // is already type specialized
                specialize = false;
            }
        }
        if(instr->m_opcode == Js::OpCode::BrTrue_A)
        {
            UpdateIntBoundsForNotEqualBranch(src1Val, nullptr, 0);
            opcode = Js::OpCode::BrTrue_I4;
        }
        else
        {
            UpdateIntBoundsForEqualBranch(src1Val, nullptr, 0);
            opcode = Js::OpCode::BrFalse_I4;
        }
        if(!specialize)
        {
            return false;
        }

        newMin = 2; newMax = 1;  // We'll assert if we make a range where min > max
        break;
    }

    case Js::OpCode::MultiBr:
        newMin = min;
        newMax = max;
        opcode = instr->m_opcode;
        break;

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::StElemC:
        if(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyAnyArrayWithNativeFloatValues())
        {
            src1Val = src1OriginalVal;
        }
        return TypeSpecializeStElem(pInstr, src1Val, pDstVal);

    case Js::OpCode::NewScArray:
    case Js::OpCode::NewScArrayWithMissingValues:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
#if !FLOATVAR
    case Js::OpCode::StSlotBoxTemp:
#endif
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_FixupForStackArgs:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_SpreadArg:
    // For this one we need to implement type specialization
    //case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::Ret:
    case Js::OpCode::LdElemUndef:
    case Js::OpCode::LdElemUndefScoped:
        return false;

    default:
        if (OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
        {
            newMin = min;
            newMax = max;
            opcode = instr->m_opcode;
            break; // Note: we must keep checkTypeSpecWorth = false to make sure we never return false from this function.
        }
        return false;
    }

    // If this instruction is in a range of instructions where int overflow does not matter, we will still specialize it (won't
    // leave it unspecialized based on heuristics), since it is most likely worth specializing, and the dst value needs to be
    // guaranteed to be an int
    if(checkTypeSpecWorth &&
        !ignoredIntOverflow &&
        !ignoredNegativeZero &&
        instr->ShouldCheckForIntOverflow() &&
        !IsWorthSpecializingToInt32(instr, src1Val))
    {
        // Even though type specialization is being skipped since it may not be worth it, the proper value should still be
        // maintained so that the result may be type specialized later. An int value is not created for the dst in any of
        // the following cases.
        // - A bailout check is necessary to specialize this instruction. The bailout check is what guarantees the result to be
        //   an int, but since we're not going to specialize this instruction, there won't be a bailout check.
        // - Aggressive int type specialization is disabled and we're in a loop prepass. We're conservative on dst values in
        //   that case, especially if the dst sym is live on the back-edge.
        if(bailOutKind == IR::BailOutInvalid &&
            instr->GetDst() &&
            (DoAggressiveIntTypeSpec() || !this->IsLoopPrePass()))
        {
            *pDstVal = CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, nullptr);
        }

        if(instr->GetSrc2())
        {
            instr->FreeSrc2();
        }
        return false;
    }

    this->ignoredIntOverflowForCurrentInstr = ignoredIntOverflow;
    this->ignoredNegativeZeroForCurrentInstr = ignoredNegativeZero;

    {
        // Try CSE again before modifying the IR, in case some attributes are required for successful CSE
        Value *src1IndirIndexVal = nullptr;
        Value *src2Val = nullptr;
        if(CSEOptimize(currentBlock, &instr, &src1Val, &src2Val, &src1IndirIndexVal, true /* intMathExprOnly */))
        {
            *redoTypeSpecRef = true;
            return false;
        }
    }

    const Js::OpCode originalOpCode = instr->m_opcode;
    if (!this->IsLoopPrePass())
    {
        // No re-write on prepass
        instr->m_opcode = opcode;
    }

    Value *src1ValueToSpecialize = src1Val;
    if(lossy)
    {
        // Lossy conversions to int32 must be done based on the original source values. For instance, if one of the values is a
        // float constant with a value that fits in a uint32 but not an int32, and the instruction can ignore int overflow, the
        // source value for the purposes of int specialization would have been changed to an int constant value by ignoring
        // overflow. If we were to specialize the sym using the int constant value, it would be treated as a lossless
        // conversion, but since there may be subsequent uses of the same float constant value that may not ignore overflow,
        // this must be treated as a lossy conversion by specializing the sym using the original float constant value.
        src1ValueToSpecialize = src1OriginalVal;
    }

    // Make sure the srcs are specialized
    IR::Opnd *src1 = instr->GetSrc1();
    this->ToInt32(instr, src1, this->currentBlock, src1ValueToSpecialize, nullptr, lossy);

    if(bailOutKind != IR::BailOutInvalid && !this->IsLoopPrePass())
    {
        GenerateBailAtOperation(&instr, bailOutKind);
    }

    if (!skipDst)
    {
        IR::Opnd *dst = instr->GetDst();
        if (dst)
        {
            AssertMsg(!(isTransfer && !this->IsLoopPrePass()) || min == newMin && max == newMax, "If this is just a copy, old/new min/max should be the same");
            TypeSpecializeIntDst(
                instr,
                originalOpCode,
                isTransfer ? src1Val : nullptr,
                src1Val,
                nullptr,
                bailOutKind,
                newMin,
                newMax,
                pDstVal,
                addSubConstantInfo.HasInfo() ? &addSubConstantInfo : nullptr);
        }
    }

    if(bailOutKind == IR::BailOutInvalid)
    {
        GOPT_TRACE(_u("Type specialized to INT\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
        {
            Output::Print(_u("Type specialized to INT: "));
            Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
        }
#endif
    }
    else
    {
        GOPT_TRACE(_u("Type specialized to INT with bailout on:\n"));
        if(bailOutKind & IR::BailOutOnOverflow)
        {
            GOPT_TRACE(_u("    Overflow\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
            {
                Output::Print(_u("Type specialized to INT with bailout (%S): "), "Overflow");
                Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
            }
#endif
        }
        if(bailOutKind & IR::BailOutOnNegativeZero)
        {
            GOPT_TRACE(_u("    Zero\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
            {
                Output::Print(_u("Type specialized to INT with bailout (%S): "), "Zero");
                Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
            }
#endif
        }
    }

    return true;
}